

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Frodo1344.c
# Opt level: O2

uint32_t Hacl_Frodo1344_crypto_kem_enc(uint8_t *ct,uint8_t *ss,uint8_t *pk)

{
  uint16_t *puVar1;
  uint32_t n;
  uint8_t *seed;
  uint32_t n_00;
  uint16_t *in_R8;
  uint16_t *in_R9;
  uint8_t coins [32];
  uint8_t seed_se_k [64];
  uint8_t pkh_mu [64];
  uint16_t mu_encode [64];
  uint16_t v_matrix [64];
  uint16_t epp_matrix [64];
  uint16_t sp_matrix [10752];
  uint16_t ep_matrix [10752];
  uint16_t b_matrix [10752];
  uint16_t bp_matrix [10752];
  uint8_t r [43136];
  uint8_t shake_input_ss [602713];
  
  coins[0x10] = '\0';
  coins[0x11] = '\0';
  coins[0x12] = '\0';
  coins[0x13] = '\0';
  coins[0x14] = '\0';
  coins[0x15] = '\0';
  coins[0x16] = '\0';
  coins[0x17] = '\0';
  coins[0x18] = '\0';
  coins[0x19] = '\0';
  coins[0x1a] = '\0';
  coins[0x1b] = '\0';
  coins[0x1c] = '\0';
  coins[0x1d] = '\0';
  coins[0x1e] = '\0';
  coins[0x1f] = '\0';
  coins[0] = '\0';
  coins[1] = '\0';
  coins[2] = '\0';
  coins[3] = '\0';
  coins[4] = '\0';
  coins[5] = '\0';
  coins[6] = '\0';
  coins[7] = '\0';
  coins[8] = '\0';
  coins[9] = '\0';
  coins[10] = '\0';
  coins[0xb] = '\0';
  coins[0xc] = '\0';
  coins[0xd] = '\0';
  coins[0xe] = '\0';
  coins[0xf] = '\0';
  randombytes_(0x20,coins);
  seed_se_k[0x30] = '\0';
  seed_se_k[0x31] = '\0';
  seed_se_k[0x32] = '\0';
  seed_se_k[0x33] = '\0';
  seed_se_k[0x34] = '\0';
  seed_se_k[0x35] = '\0';
  seed_se_k[0x36] = '\0';
  seed_se_k[0x37] = '\0';
  seed_se_k[0x38] = '\0';
  seed_se_k[0x39] = '\0';
  seed_se_k[0x3a] = '\0';
  seed_se_k[0x3b] = '\0';
  seed_se_k[0x3c] = '\0';
  seed_se_k[0x3d] = '\0';
  seed_se_k[0x3e] = '\0';
  seed_se_k[0x3f] = '\0';
  seed_se_k[0x20] = '\0';
  seed_se_k[0x21] = '\0';
  seed_se_k[0x22] = '\0';
  seed_se_k[0x23] = '\0';
  seed_se_k[0x24] = '\0';
  seed_se_k[0x25] = '\0';
  seed_se_k[0x26] = '\0';
  seed_se_k[0x27] = '\0';
  seed_se_k[0x28] = '\0';
  seed_se_k[0x29] = '\0';
  seed_se_k[0x2a] = '\0';
  seed_se_k[0x2b] = '\0';
  seed_se_k[0x2c] = '\0';
  seed_se_k[0x2d] = '\0';
  seed_se_k[0x2e] = '\0';
  seed_se_k[0x2f] = '\0';
  seed_se_k[0x10] = '\0';
  seed_se_k[0x11] = '\0';
  seed_se_k[0x12] = '\0';
  seed_se_k[0x13] = '\0';
  seed_se_k[0x14] = '\0';
  seed_se_k[0x15] = '\0';
  seed_se_k[0x16] = '\0';
  seed_se_k[0x17] = '\0';
  seed_se_k[0x18] = '\0';
  seed_se_k[0x19] = '\0';
  seed_se_k[0x1a] = '\0';
  seed_se_k[0x1b] = '\0';
  seed_se_k[0x1c] = '\0';
  seed_se_k[0x1d] = '\0';
  seed_se_k[0x1e] = '\0';
  seed_se_k[0x1f] = '\0';
  seed_se_k[0] = '\0';
  seed_se_k[1] = '\0';
  seed_se_k[2] = '\0';
  seed_se_k[3] = '\0';
  seed_se_k[4] = '\0';
  seed_se_k[5] = '\0';
  seed_se_k[6] = '\0';
  seed_se_k[7] = '\0';
  seed_se_k[8] = '\0';
  seed_se_k[9] = '\0';
  seed_se_k[10] = '\0';
  seed_se_k[0xb] = '\0';
  seed_se_k[0xc] = '\0';
  seed_se_k[0xd] = '\0';
  seed_se_k[0xe] = '\0';
  seed_se_k[0xf] = '\0';
  pkh_mu[0x30] = '\0';
  pkh_mu[0x31] = '\0';
  pkh_mu[0x32] = '\0';
  pkh_mu[0x33] = '\0';
  pkh_mu[0x34] = '\0';
  pkh_mu[0x35] = '\0';
  pkh_mu[0x36] = '\0';
  pkh_mu[0x37] = '\0';
  pkh_mu[0x38] = '\0';
  pkh_mu[0x39] = '\0';
  pkh_mu[0x3a] = '\0';
  pkh_mu[0x3b] = '\0';
  pkh_mu[0x3c] = '\0';
  pkh_mu[0x3d] = '\0';
  pkh_mu[0x3e] = '\0';
  pkh_mu[0x3f] = '\0';
  pkh_mu[0x20] = '\0';
  pkh_mu[0x21] = '\0';
  pkh_mu[0x22] = '\0';
  pkh_mu[0x23] = '\0';
  pkh_mu[0x24] = '\0';
  pkh_mu[0x25] = '\0';
  pkh_mu[0x26] = '\0';
  pkh_mu[0x27] = '\0';
  pkh_mu[0x28] = '\0';
  pkh_mu[0x29] = '\0';
  pkh_mu[0x2a] = '\0';
  pkh_mu[0x2b] = '\0';
  pkh_mu[0x2c] = '\0';
  pkh_mu[0x2d] = '\0';
  pkh_mu[0x2e] = '\0';
  pkh_mu[0x2f] = '\0';
  pkh_mu[0x10] = '\0';
  pkh_mu[0x11] = '\0';
  pkh_mu[0x12] = '\0';
  pkh_mu[0x13] = '\0';
  pkh_mu[0x14] = '\0';
  pkh_mu[0x15] = '\0';
  pkh_mu[0x16] = '\0';
  pkh_mu[0x17] = '\0';
  pkh_mu[0x18] = '\0';
  pkh_mu[0x19] = '\0';
  pkh_mu[0x1a] = '\0';
  pkh_mu[0x1b] = '\0';
  pkh_mu[0x1c] = '\0';
  pkh_mu[0x1d] = '\0';
  pkh_mu[0x1e] = '\0';
  pkh_mu[0x1f] = '\0';
  pkh_mu[0] = '\0';
  pkh_mu[1] = '\0';
  pkh_mu[2] = '\0';
  pkh_mu[3] = '\0';
  pkh_mu[4] = '\0';
  pkh_mu[5] = '\0';
  pkh_mu[6] = '\0';
  pkh_mu[7] = '\0';
  pkh_mu[8] = '\0';
  pkh_mu[9] = '\0';
  pkh_mu[10] = '\0';
  pkh_mu[0xb] = '\0';
  pkh_mu[0xc] = '\0';
  pkh_mu[0xd] = '\0';
  pkh_mu[0xe] = '\0';
  pkh_mu[0xf] = '\0';
  Hacl_Hash_SHA3_shake256(pkh_mu,0x20,pk,0x5410);
  pkh_mu[0x30] = coins[0x10];
  pkh_mu[0x31] = coins[0x11];
  pkh_mu[0x32] = coins[0x12];
  pkh_mu[0x33] = coins[0x13];
  pkh_mu[0x34] = coins[0x14];
  pkh_mu[0x35] = coins[0x15];
  pkh_mu[0x36] = coins[0x16];
  pkh_mu[0x37] = coins[0x17];
  pkh_mu[0x38] = coins[0x18];
  pkh_mu[0x39] = coins[0x19];
  pkh_mu[0x3a] = coins[0x1a];
  pkh_mu[0x3b] = coins[0x1b];
  pkh_mu[0x3c] = coins[0x1c];
  pkh_mu[0x3d] = coins[0x1d];
  pkh_mu[0x3e] = coins[0x1e];
  pkh_mu[0x3f] = coins[0x1f];
  pkh_mu[0x20] = coins[0];
  pkh_mu[0x21] = coins[1];
  pkh_mu[0x22] = coins[2];
  pkh_mu[0x23] = coins[3];
  pkh_mu[0x24] = coins[4];
  pkh_mu[0x25] = coins[5];
  pkh_mu[0x26] = coins[6];
  pkh_mu[0x27] = coins[7];
  pkh_mu[0x28] = coins[8];
  pkh_mu[0x29] = coins[9];
  pkh_mu[0x2a] = coins[10];
  pkh_mu[0x2b] = coins[0xb];
  pkh_mu[0x2c] = coins[0xc];
  pkh_mu[0x2d] = coins[0xd];
  pkh_mu[0x2e] = coins[0xe];
  pkh_mu[0x2f] = coins[0xf];
  Hacl_Hash_SHA3_shake256(seed_se_k,0x40,pkh_mu,0x40);
  memset(sp_matrix,0,0x5400);
  memset(ep_matrix,0,0x5400);
  epp_matrix[0x38] = 0;
  epp_matrix[0x39] = 0;
  epp_matrix[0x3a] = 0;
  epp_matrix[0x3b] = 0;
  epp_matrix[0x3c] = 0;
  epp_matrix[0x3d] = 0;
  epp_matrix[0x3e] = 0;
  epp_matrix[0x3f] = 0;
  epp_matrix[0x30] = 0;
  epp_matrix[0x31] = 0;
  epp_matrix[0x32] = 0;
  epp_matrix[0x33] = 0;
  epp_matrix[0x34] = 0;
  epp_matrix[0x35] = 0;
  epp_matrix[0x36] = 0;
  epp_matrix[0x37] = 0;
  epp_matrix[0x28] = 0;
  epp_matrix[0x29] = 0;
  epp_matrix[0x2a] = 0;
  epp_matrix[0x2b] = 0;
  epp_matrix[0x2c] = 0;
  epp_matrix[0x2d] = 0;
  epp_matrix[0x2e] = 0;
  epp_matrix[0x2f] = 0;
  epp_matrix[0x20] = 0;
  epp_matrix[0x21] = 0;
  epp_matrix[0x22] = 0;
  epp_matrix[0x23] = 0;
  epp_matrix[0x24] = 0;
  epp_matrix[0x25] = 0;
  epp_matrix[0x26] = 0;
  epp_matrix[0x27] = 0;
  epp_matrix[0x18] = 0;
  epp_matrix[0x19] = 0;
  epp_matrix[0x1a] = 0;
  epp_matrix[0x1b] = 0;
  epp_matrix[0x1c] = 0;
  epp_matrix[0x1d] = 0;
  epp_matrix[0x1e] = 0;
  epp_matrix[0x1f] = 0;
  epp_matrix[0x10] = 0;
  epp_matrix[0x11] = 0;
  epp_matrix[0x12] = 0;
  epp_matrix[0x13] = 0;
  epp_matrix[0x14] = 0;
  epp_matrix[0x15] = 0;
  epp_matrix[0x16] = 0;
  epp_matrix[0x17] = 0;
  epp_matrix[8] = 0;
  epp_matrix[9] = 0;
  epp_matrix[10] = 0;
  epp_matrix[0xb] = 0;
  epp_matrix[0xc] = 0;
  epp_matrix[0xd] = 0;
  epp_matrix[0xe] = 0;
  epp_matrix[0xf] = 0;
  epp_matrix[0] = 0;
  epp_matrix[1] = 0;
  epp_matrix[2] = 0;
  epp_matrix[3] = 0;
  epp_matrix[4] = 0;
  epp_matrix[5] = 0;
  epp_matrix[6] = 0;
  epp_matrix[7] = 0;
  memset(r,0,0xa880);
  Hacl_Hash_SHA3_shake256(r,0xa880,&stack0xffffffffffc690b8,0x21);
  Lib_Memzero0_memzero0(&stack0xffffffffffc690b8,0x21);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8,0x540,r,sp_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8,0x540,r + 0x5400,ep_matrix);
  puVar1 = epp_matrix;
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8,8,r + 0xa800,epp_matrix);
  memset(bp_matrix,0,0x5400);
  memset(shake_input_ss + 0x54a0,0,0x372000);
  n_00 = (uint32_t)(shake_input_ss + 0x54a0);
  Hacl_Impl_Frodo_Params_frodo_gen_matrix((Spec_Frodo_Params_frodo_gen_a)pk,n_00,seed,puVar1);
  Hacl_Impl_Matrix_matrix_mul(0x540,(uint32_t)sp_matrix,n_00,bp_matrix,in_R8,in_R9);
  Hacl_Impl_Matrix_matrix_add(8,0x540,bp_matrix,ep_matrix);
  Hacl_Impl_Frodo_Pack_frodo_pack(8,0x540,(uint32_t)bp_matrix,(uint16_t *)ct,(uint8_t *)in_R8);
  v_matrix[0x38] = 0;
  v_matrix[0x39] = 0;
  v_matrix[0x3a] = 0;
  v_matrix[0x3b] = 0;
  v_matrix[0x3c] = 0;
  v_matrix[0x3d] = 0;
  v_matrix[0x3e] = 0;
  v_matrix[0x3f] = 0;
  v_matrix[0x30] = 0;
  v_matrix[0x31] = 0;
  v_matrix[0x32] = 0;
  v_matrix[0x33] = 0;
  v_matrix[0x34] = 0;
  v_matrix[0x35] = 0;
  v_matrix[0x36] = 0;
  v_matrix[0x37] = 0;
  v_matrix[0x28] = 0;
  v_matrix[0x29] = 0;
  v_matrix[0x2a] = 0;
  v_matrix[0x2b] = 0;
  v_matrix[0x2c] = 0;
  v_matrix[0x2d] = 0;
  v_matrix[0x2e] = 0;
  v_matrix[0x2f] = 0;
  v_matrix[0x20] = 0;
  v_matrix[0x21] = 0;
  v_matrix[0x22] = 0;
  v_matrix[0x23] = 0;
  v_matrix[0x24] = 0;
  v_matrix[0x25] = 0;
  v_matrix[0x26] = 0;
  v_matrix[0x27] = 0;
  v_matrix[0x18] = 0;
  v_matrix[0x19] = 0;
  v_matrix[0x1a] = 0;
  v_matrix[0x1b] = 0;
  v_matrix[0x1c] = 0;
  v_matrix[0x1d] = 0;
  v_matrix[0x1e] = 0;
  v_matrix[0x1f] = 0;
  v_matrix[0x10] = 0;
  v_matrix[0x11] = 0;
  v_matrix[0x12] = 0;
  v_matrix[0x13] = 0;
  v_matrix[0x14] = 0;
  v_matrix[0x15] = 0;
  v_matrix[0x16] = 0;
  v_matrix[0x17] = 0;
  v_matrix[8] = 0;
  v_matrix[9] = 0;
  v_matrix[10] = 0;
  v_matrix[0xb] = 0;
  v_matrix[0xc] = 0;
  v_matrix[0xd] = 0;
  v_matrix[0xe] = 0;
  v_matrix[0xf] = 0;
  v_matrix[0] = 0;
  v_matrix[1] = 0;
  v_matrix[2] = 0;
  v_matrix[3] = 0;
  v_matrix[4] = 0;
  v_matrix[5] = 0;
  v_matrix[6] = 0;
  v_matrix[7] = 0;
  memset(b_matrix,0,0x5400);
  Hacl_Impl_Frodo_Pack_frodo_unpack(0x540,8,(int)pk + 0x10,(uint8_t *)b_matrix,in_R8);
  Hacl_Impl_Matrix_matrix_mul(8,(uint32_t)sp_matrix,(uint32_t)b_matrix,v_matrix,in_R8,in_R9);
  puVar1 = epp_matrix;
  Hacl_Impl_Matrix_matrix_add(8,8,v_matrix,epp_matrix);
  mu_encode[0x38] = 0;
  mu_encode[0x39] = 0;
  mu_encode[0x3a] = 0;
  mu_encode[0x3b] = 0;
  mu_encode[0x3c] = 0;
  mu_encode[0x3d] = 0;
  mu_encode[0x3e] = 0;
  mu_encode[0x3f] = 0;
  mu_encode[0x30] = 0;
  mu_encode[0x31] = 0;
  mu_encode[0x32] = 0;
  mu_encode[0x33] = 0;
  mu_encode[0x34] = 0;
  mu_encode[0x35] = 0;
  mu_encode[0x36] = 0;
  mu_encode[0x37] = 0;
  mu_encode[0x28] = 0;
  mu_encode[0x29] = 0;
  mu_encode[0x2a] = 0;
  mu_encode[0x2b] = 0;
  mu_encode[0x2c] = 0;
  mu_encode[0x2d] = 0;
  mu_encode[0x2e] = 0;
  mu_encode[0x2f] = 0;
  mu_encode[0x20] = 0;
  mu_encode[0x21] = 0;
  mu_encode[0x22] = 0;
  mu_encode[0x23] = 0;
  mu_encode[0x24] = 0;
  mu_encode[0x25] = 0;
  mu_encode[0x26] = 0;
  mu_encode[0x27] = 0;
  mu_encode[0x18] = 0;
  mu_encode[0x19] = 0;
  mu_encode[0x1a] = 0;
  mu_encode[0x1b] = 0;
  mu_encode[0x1c] = 0;
  mu_encode[0x1d] = 0;
  mu_encode[0x1e] = 0;
  mu_encode[0x1f] = 0;
  mu_encode[0x10] = 0;
  mu_encode[0x11] = 0;
  mu_encode[0x12] = 0;
  mu_encode[0x13] = 0;
  mu_encode[0x14] = 0;
  mu_encode[0x15] = 0;
  mu_encode[0x16] = 0;
  mu_encode[0x17] = 0;
  mu_encode[8] = 0;
  mu_encode[9] = 0;
  mu_encode[10] = 0;
  mu_encode[0xb] = 0;
  mu_encode[0xc] = 0;
  mu_encode[0xd] = 0;
  mu_encode[0xe] = 0;
  mu_encode[0xf] = 0;
  mu_encode[0] = 0;
  mu_encode[1] = 0;
  mu_encode[2] = 0;
  mu_encode[3] = 0;
  mu_encode[4] = 0;
  mu_encode[5] = 0;
  mu_encode[6] = 0;
  mu_encode[7] = 0;
  Hacl_Impl_Frodo_Encode_frodo_key_encode
            ((uint32_t)coins,(uint32_t)mu_encode,n,(uint8_t *)puVar1,in_R8);
  Hacl_Impl_Matrix_matrix_add(8,8,v_matrix,mu_encode);
  Lib_Memzero0_memzero0(mu_encode,0x80);
  Hacl_Impl_Frodo_Pack_frodo_pack(8,8,(uint32_t)v_matrix,(uint16_t *)(ct + 0x5400),(uint8_t *)in_R8)
  ;
  Lib_Memzero0_memzero0(v_matrix,0x80);
  Lib_Memzero0_memzero0(sp_matrix,0x5400);
  Lib_Memzero0_memzero0(ep_matrix,0x5400);
  Lib_Memzero0_memzero0(epp_matrix,0x80);
  memcpy(shake_input_ss,ct,0x5480);
  Hacl_Hash_SHA3_shake256(ss,0x20,shake_input_ss,0x54a0);
  Lib_Memzero0_memzero0(shake_input_ss,0x54a0);
  Lib_Memzero0_memzero0(seed_se_k,0x40);
  Lib_Memzero0_memzero0(coins,0x20);
  return 0;
}

Assistant:

uint32_t Hacl_Frodo1344_crypto_kem_enc(uint8_t *ct, uint8_t *ss, uint8_t *pk)
{
  uint8_t coins[32U] = { 0U };
  randombytes_(32U, coins);
  uint8_t seed_se_k[64U] = { 0U };
  uint8_t pkh_mu[64U] = { 0U };
  Hacl_Hash_SHA3_shake256(pkh_mu, 32U, pk, 21520U);
  memcpy(pkh_mu + 32U, coins, 32U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake256(seed_se_k, 64U, pkh_mu, 64U);
  uint8_t *seed_se = seed_se_k;
  uint8_t *k = seed_se_k + 32U;
  uint8_t *seed_a = pk;
  uint8_t *b = pk + 16U;
  uint16_t sp_matrix[10752U] = { 0U };
  uint16_t ep_matrix[10752U] = { 0U };
  uint16_t epp_matrix[64U] = { 0U };
  uint8_t r[43136U] = { 0U };
  uint8_t shake_input_seed_se[33U] = { 0U };
  shake_input_seed_se[0U] = 0x96U;
  memcpy(shake_input_seed_se + 1U, seed_se, 32U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake256(r, 43136U, shake_input_seed_se, 33U);
  Lib_Memzero0_memzero(shake_input_seed_se, 33U, uint8_t, void *);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8U, 1344U, r, sp_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8U, 1344U, r + 21504U, ep_matrix);
  Hacl_Impl_Frodo_Sample_frodo_sample_matrix1344(8U, 8U, r + 43008U, epp_matrix);
  uint8_t *c1 = ct;
  uint8_t *c2 = ct + 21504U;
  uint16_t bp_matrix[10752U] = { 0U };
  KRML_CHECK_SIZE(sizeof (uint16_t), 1806336U);
  uint16_t a_matrix[1806336U] = { 0U };
  Hacl_Impl_Frodo_Params_frodo_gen_matrix(Spec_Frodo_Params_SHAKE128, 1344U, seed_a, a_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 1344U, 1344U, sp_matrix, a_matrix, bp_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 1344U, bp_matrix, ep_matrix);
  Hacl_Impl_Frodo_Pack_frodo_pack(8U, 1344U, 16U, bp_matrix, c1);
  uint16_t v_matrix[64U] = { 0U };
  uint16_t b_matrix[10752U] = { 0U };
  Hacl_Impl_Frodo_Pack_frodo_unpack(1344U, 8U, 16U, b, b_matrix);
  Hacl_Impl_Matrix_matrix_mul(8U, 1344U, 8U, sp_matrix, b_matrix, v_matrix);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, v_matrix, epp_matrix);
  uint16_t mu_encode[64U] = { 0U };
  Hacl_Impl_Frodo_Encode_frodo_key_encode(16U, 4U, 8U, coins, mu_encode);
  Hacl_Impl_Matrix_matrix_add(8U, 8U, v_matrix, mu_encode);
  Lib_Memzero0_memzero(mu_encode, 64U, uint16_t, void *);
  Hacl_Impl_Frodo_Pack_frodo_pack(8U, 8U, 16U, v_matrix, c2);
  Lib_Memzero0_memzero(v_matrix, 64U, uint16_t, void *);
  Lib_Memzero0_memzero(sp_matrix, 10752U, uint16_t, void *);
  Lib_Memzero0_memzero(ep_matrix, 10752U, uint16_t, void *);
  Lib_Memzero0_memzero(epp_matrix, 64U, uint16_t, void *);
  uint32_t ss_init_len = 21664U;
  KRML_CHECK_SIZE(sizeof (uint8_t), ss_init_len);
  uint8_t shake_input_ss[ss_init_len];
  memset(shake_input_ss, 0U, ss_init_len * sizeof (uint8_t));
  memcpy(shake_input_ss, ct, 21632U * sizeof (uint8_t));
  memcpy(shake_input_ss + 21632U, k, 32U * sizeof (uint8_t));
  Hacl_Hash_SHA3_shake256(ss, 32U, shake_input_ss, ss_init_len);
  Lib_Memzero0_memzero(shake_input_ss, ss_init_len, uint8_t, void *);
  Lib_Memzero0_memzero(seed_se_k, 64U, uint8_t, void *);
  Lib_Memzero0_memzero(coins, 32U, uint8_t, void *);
  return 0U;
}